

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool picojson::
     _parse<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (default_parse_context *ctx,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  undefined8 uVar1;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  intmax_t i;
  long lVar6;
  long lVar7;
  FILE *__stream;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_00;
  double f_00;
  bool local_13a;
  bool local_122;
  bool local_10a;
  intmax_t ival;
  undefined1 local_e0 [8];
  string num_str;
  char *endp;
  double f;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  int local_24;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *piStack_20;
  int ch;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  default_parse_context *ctx_local;
  
  piStack_20 = in;
  in_local = (input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ctx;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::skip_ws(in);
  local_24 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::getc(piStack_20,(FILE *)in);
  this = piStack_20;
  if (local_24 == 0x22) {
    ctx_local._7_1_ =
         default_parse_context::
         parse_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   ((default_parse_context *)in_local,piStack_20);
    goto LAB_0010c677;
  }
  if (local_24 == 0x5b) {
    ctx_local._7_1_ =
         _parse_array<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   ((default_parse_context *)in_local,piStack_20);
    goto LAB_0010c677;
  }
  if (local_24 == 0x66) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"alse",&local_81);
    bVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match(this,&local_80);
    local_122 = false;
    if (bVar2) {
      local_122 = default_parse_context::set_bool((default_parse_context *)in_local,false);
    }
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    if (local_122 == false) {
      ctx_local._7_1_ = 0;
    }
    else {
      ctx_local._7_1_ = 1;
    }
    goto LAB_0010c677;
  }
  if (local_24 == 0x6e) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ull",&local_49);
    bVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match(this,&local_48);
    local_10a = false;
    if (bVar2) {
      local_10a = default_parse_context::set_null((default_parse_context *)in_local);
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (local_10a == false) {
      ctx_local._7_1_ = 0;
    }
    else {
      ctx_local._7_1_ = 1;
    }
    goto LAB_0010c677;
  }
  if (local_24 == 0x74) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"rue",(allocator<char> *)((long)&f + 7));
    bVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match(this,&local_a8);
    local_13a = false;
    if (bVar2) {
      local_13a = default_parse_context::set_bool((default_parse_context *)in_local,true);
    }
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&f + 7));
    if (local_13a == false) {
      ctx_local._7_1_ = 0;
    }
    else {
      ctx_local._7_1_ = 1;
    }
    goto LAB_0010c677;
  }
  if (local_24 == 0x7b) {
    ctx_local._7_1_ =
         _parse_object<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   ((default_parse_context *)in_local,piStack_20);
    goto LAB_0010c677;
  }
  if (((local_24 < 0x30) || (0x39 < local_24)) && (local_24 != 0x2d)) {
    input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::ungetc(piStack_20,(int)in,__stream);
    ctx_local._7_1_ = 0;
    goto LAB_0010c677;
  }
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ungetc(piStack_20,(int)in,__stream);
  _parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_e0,(picojson *)piStack_20,in_00);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    piVar4 = __errno_location();
    *piVar4 = 0;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    i = strtoimax(pcVar5,(char **)((long)&num_str.field_2 + 8),10);
    piVar4 = __errno_location();
    if (((*piVar4 == 0) && (lVar6 = std::numeric_limits<long>::min(), lVar6 <= i)) &&
       (lVar6 = std::numeric_limits<long>::max(), uVar1 = num_str.field_2._8_8_, i <= lVar6)) {
      lVar6 = std::__cxx11::string::c_str();
      lVar7 = std::__cxx11::string::size();
      if (uVar1 == lVar6 + lVar7) {
        default_parse_context::set_int64((default_parse_context *)in_local,i);
        ctx_local._7_1_ = 1;
        goto LAB_0010c65a;
      }
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    f_00 = strtod(pcVar5,(char **)((long)&num_str.field_2 + 8));
    lVar6 = std::__cxx11::string::c_str();
    lVar7 = std::__cxx11::string::size();
    if (num_str.field_2._8_8_ == lVar6 + lVar7) {
      default_parse_context::set_number((default_parse_context *)in_local,f_00);
      ctx_local._7_1_ = 1;
    }
    else {
      ctx_local._7_1_ = 0;
    }
  }
  else {
    ctx_local._7_1_ = 0;
  }
LAB_0010c65a:
  std::__cxx11::string::~string((string *)local_e0);
LAB_0010c677:
  return (bool)(ctx_local._7_1_ & 1);
}

Assistant:

inline bool _parse(Context &ctx, input<Iter> &in) {
  in.skip_ws();
  int ch = in.getc();
  switch (ch) {
#define IS(ch, text, op)                                                                                                           \
  case ch:                                                                                                                         \
    if (in.match(text) && op) {                                                                                                    \
      return true;                                                                                                                 \
    } else {                                                                                                                       \
      return false;                                                                                                                \
    }
    IS('n', "ull", ctx.set_null());
    IS('f', "alse", ctx.set_bool(false));
    IS('t', "rue", ctx.set_bool(true));
#undef IS
  case '"':
    return ctx.parse_string(in);
  case '[':
    return _parse_array(ctx, in);
  case '{':
    return _parse_object(ctx, in);
  default:
    if (('0' <= ch && ch <= '9') || ch == '-') {
      double f;
      char *endp;
      in.ungetc();
      std::string num_str(_parse_number(in));
      if (num_str.empty()) {
        return false;
      }
#ifdef PICOJSON_USE_INT64
      {
        errno = 0;
        intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
        if (errno == 0 && std::numeric_limits<int64_t>::min() <= ival && ival <= std::numeric_limits<int64_t>::max() &&
            endp == num_str.c_str() + num_str.size()) {
          ctx.set_int64(ival);
          return true;
        }
      }
#endif
      f = strtod(num_str.c_str(), &endp);
      if (endp == num_str.c_str() + num_str.size()) {
        ctx.set_number(f);
        return true;
      }
      return false;
    }
    break;
  }
  in.ungetc();
  return false;
}